

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::TryCallResolveOrRejectHandler
              (Var handler,Var value,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  bool bVar2;
  RecyclableObject *this_00;
  JavascriptMethod p_Var3;
  Var pvVar4;
  
  pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  bVar2 = JavascriptConversion::IsCallable(handler);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  this_00 = VarTo<Js::RecyclableObject>(handler);
  this = scriptContext->threadContext;
  bVar2 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
  if (scriptContext->threadContext->noJsReentrancy != true) {
    p_Var3 = RecyclableObject::GetEntryPoint(this_00);
    CheckIsExecutable(this_00,p_Var3);
    p_Var3 = RecyclableObject::GetEntryPoint(this_00);
    pvVar4 = (*p_Var3)(this_00,(CallInfo)this_00,0x2000002,0,0,0,0,0x2000002,pRVar1,value);
    this->reentrancySafeOrHandled = bVar2;
    return pvVar4;
  }
  Throw::FatalJsReentrancyError();
}

Assistant:

Var JavascriptPromise::TryCallResolveOrRejectHandler(Var handler, Var value, ScriptContext* scriptContext)
    {
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        if (!JavascriptConversion::IsCallable(handler))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        RecyclableObject* handlerFunc = VarTo<RecyclableObject>(handler);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                    handlerFunc, CallInfo(CallFlags_Value, 2),
                    undefinedVar,
                    value);
        }
        END_SAFE_REENTRANT_CALL
    }